

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraylist.c
# Opt level: O3

int array_list_put_idx(array_list *arr,size_t idx,void *data)

{
  int iVar1;
  void **ppvVar2;
  int iVar3;
  size_t sVar4;
  
  iVar3 = -1;
  if (idx != 0xffffffffffffffff) {
    iVar1 = array_list_expand_internal(arr,idx + 1);
    if (iVar1 == 0) {
      ppvVar2 = arr->array;
      sVar4 = arr->length;
      if ((idx < sVar4) && (ppvVar2[idx] != (void *)0x0)) {
        (*arr->free_fn)(ppvVar2[idx]);
        ppvVar2 = arr->array;
        sVar4 = arr->length;
      }
      ppvVar2[idx] = data;
      if (sVar4 <= idx && idx - sVar4 != 0) {
        memset(arr->array + sVar4,0,(idx - sVar4) * 8);
        sVar4 = arr->length;
      }
      iVar3 = 0;
      if (sVar4 <= idx) {
        arr->length = idx + 1;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int array_list_put_idx(struct array_list *arr, size_t idx, void *data)
{
	if (idx > SIZE_T_MAX - 1)
		return -1;
	if (array_list_expand_internal(arr, idx + 1))
		return -1;
	if (idx < arr->length && arr->array[idx])
		arr->free_fn(arr->array[idx]);
	arr->array[idx] = data;
	if (idx > arr->length)
	{
		/* Zero out the arraylist slots in between the old length
		   and the newly added entry so we know those entries are
		   empty.
		   e.g. when setting array[7] in an array that used to be 
		   only 5 elements longs, array[5] and array[6] need to be
		   set to 0.
		 */
		memset(arr->array + arr->length, 0, (idx - arr->length) * sizeof(void *));
	}
	if (arr->length <= idx)
		arr->length = idx + 1;
	return 0;
}